

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss.cc
# Opt level: O2

void __thiscall
fasttext::NegativeSamplingLoss::NegativeSamplingLoss
          (NegativeSamplingLoss *this,shared_ptr<fasttext::Matrix> *wo,int neg,
          vector<long,_std::allocator<long>_> *targetCounts)

{
  pointer piVar1;
  pointer piVar2;
  double dVar3;
  pointer plVar4;
  pointer plVar5;
  size_t j;
  ulong uVar6;
  size_t i;
  ulong uVar7;
  size_t i_1;
  uint uVar8;
  uint extraout_XMM0_Dc;
  uint extraout_XMM0_Dc_00;
  uint extraout_XMM0_Dc_01;
  uint uVar9;
  uint extraout_XMM0_Dd;
  uint extraout_XMM0_Dd_00;
  uint extraout_XMM0_Dd_01;
  float local_50;
  int local_4c;
  float local_48;
  uint uStack_44;
  uint uStack_40;
  uint uStack_3c;
  
  BinaryLogisticLoss::BinaryLogisticLoss(&this->super_BinaryLogisticLoss,wo);
  (this->super_BinaryLogisticLoss).super_Loss._vptr_Loss =
       (_func_int **)&PTR__NegativeSamplingLoss_00164958;
  this->neg_ = neg;
  (this->negatives_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->negatives_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->negatives_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->uniform_)._M_param._M_a = 0;
  (this->uniform_)._M_param._M_b = 0xffffffffffffffff;
  uVar8 = 0;
  uVar9 = 0;
  local_50 = 0.0;
  uVar7 = 0;
  while( true ) {
    plVar4 = (targetCounts->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    plVar5 = (targetCounts->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if ((ulong)((long)plVar5 - (long)plVar4 >> 3) <= uVar7) break;
    dVar3 = (double)plVar4[uVar7];
    if (dVar3 < 0.0) {
      dVar3 = sqrt(dVar3);
      uVar8 = extraout_XMM0_Dc;
      uVar9 = extraout_XMM0_Dd;
    }
    else {
      dVar3 = SQRT(dVar3);
    }
    uVar6 = CONCAT44(uVar9,uVar8) & 0x7fffffffffffffff;
    uVar8 = (uint)uVar6;
    uVar9 = (uint)(uVar6 >> 0x20);
    local_50 = (float)((double)local_50 + ABS(dVar3));
    uVar7 = uVar7 + 1;
  }
  for (uVar7 = 0; uVar7 < (ulong)((long)plVar5 - (long)plVar4 >> 3); uVar7 = uVar7 + 1) {
    dVar3 = (double)plVar4[uVar7];
    if (dVar3 < 0.0) {
      dVar3 = sqrt(dVar3);
      uVar8 = extraout_XMM0_Dc_00;
      uVar9 = extraout_XMM0_Dd_00;
    }
    else {
      dVar3 = SQRT(dVar3);
    }
    uStack_44 = (uint)((ulong)dVar3 >> 0x20) & 0x7fffffff;
    uVar8 = uVar8 & 0x7fffffff;
    uVar9 = uVar9 & 0x7fffffff;
    local_48 = (ABS((float)dVar3) * 1e+07) / local_50;
    uStack_40 = uVar8;
    uStack_3c = uVar9;
    for (uVar6 = 0; (float)uVar6 < local_48; uVar6 = uVar6 + 1) {
      local_4c = (int)uVar7;
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(&this->negatives_,&local_4c);
      uVar8 = extraout_XMM0_Dc_01;
      uVar9 = extraout_XMM0_Dd_01;
    }
    plVar4 = (targetCounts->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    plVar5 = (targetCounts->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  }
  piVar1 = (this->negatives_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  piVar2 = (this->negatives_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->uniform_)._M_param._M_a = 0;
  (this->uniform_)._M_param._M_b = ((long)piVar1 - (long)piVar2 >> 2) - 1;
  return;
}

Assistant:

NegativeSamplingLoss::NegativeSamplingLoss(
    std::shared_ptr<Matrix>& wo,
    int neg,
    const std::vector<int64_t>& targetCounts)
    : BinaryLogisticLoss(wo), neg_(neg), negatives_(), uniform_() {
  real z = 0.0;
  for (size_t i = 0; i < targetCounts.size(); i++) {
    z += pow(targetCounts[i], 0.5);
  }
  for (size_t i = 0; i < targetCounts.size(); i++) {
    real c = pow(targetCounts[i], 0.5);
    for (size_t j = 0; j < c * NegativeSamplingLoss::NEGATIVE_TABLE_SIZE / z;
         j++) {
      negatives_.push_back(i);
    }
  }
  uniform_ = std::uniform_int_distribution<size_t>(0, negatives_.size() - 1);
}